

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

void try_initialize_global_cpu_info(void)

{
  __cpu_mask *p_Var1;
  uint *puVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  FILE *pFVar6;
  char *pcVar7;
  CpuSet *pCVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  uint __max_leaf;
  long lVar13;
  CpuSet *pCVar14;
  int i;
  int iVar15;
  bool bVar16;
  byte bVar17;
  uint in_XCR0;
  int freq_khz;
  vector<int,_std::allocator<int>_> cpu_max_freq_khz;
  char line [1024];
  int local_45c;
  int local_458;
  int local_454;
  vector<int,_std::allocator<int>_> local_450;
  void *local_438;
  iterator iStack_430;
  int *local_428;
  
  bVar17 = 0;
  if (g_cpu_info_initialized == '\0') {
    pFVar6 = fopen("/proc/cpuinfo","rb");
    if (pFVar6 == (FILE *)0x0) {
      g_cpucount = 1;
    }
    else {
      iVar4 = feof(pFVar6);
      iVar12 = 0;
      if (iVar4 == 0) {
        iVar12 = 0;
        do {
          pcVar7 = fgets((char *)&local_438,0x400,pFVar6);
          if (pcVar7 == (char *)0x0) break;
          iVar12 = iVar12 + (uint)(((ulong)iStack_430._M_current & 0xff) == 0x72 &&
                                  local_438 == (void *)0x6f737365636f7270);
          iVar4 = feof(pFVar6);
        } while (iVar4 == 0);
      }
      fclose(pFVar6);
      g_cpucount = 1;
      if (1 < iVar12) {
        g_cpucount = iVar12;
      }
    }
    local_438 = (void *)0x0;
    iStack_430._M_current = (int *)0x0;
    local_428 = (int *)0x0;
    iVar12 = 0;
    iVar4 = 0;
    do {
      local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = get_thread_siblings(iVar12);
      if ((int)local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start != -1) {
        if ((long)iStack_430._M_current - (long)local_438 != 0) {
          lVar10 = (long)iStack_430._M_current - (long)local_438 >> 2;
          lVar13 = 0;
          do {
            if (*(int *)((long)local_438 + lVar13 * 4) ==
                (int)local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start) goto LAB_005a00a2;
            lVar13 = lVar13 + 1;
          } while (lVar10 + (ulong)(lVar10 == 0) != lVar13);
        }
        if (iStack_430._M_current == local_428) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_438,iStack_430,(int *)&local_450);
        }
        else {
          *iStack_430._M_current =
               (int)local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iStack_430._M_current = iStack_430._M_current + 1;
        }
        iVar4 = iVar4 + 1;
      }
LAB_005a00a2:
      iVar15 = g_cpucount;
      iVar12 = iVar12 + 1;
    } while (iVar12 < g_cpucount);
    if (local_438 != (void *)0x0) {
      operator_delete(local_438,(long)local_428 - (long)local_438);
    }
    iVar12 = g_cpucount;
    if (iVar4 == 0) {
      iVar4 = iVar15;
    }
    g_physical_cpucount = iVar4;
    if (iVar15 <= iVar4) {
      g_physical_cpucount = iVar15;
    }
    g_powersave = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[0] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[1] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[2] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[3] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[4] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[5] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[6] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[7] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[8] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[9] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[10] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[0xb] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[0xc] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[0xd] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[0xe] = 0;
    g_cpu_affinity_mask_all.cpu_set.__bits[0xf] = 0;
    if (0 < g_cpucount) {
      uVar11 = (ulong)(uint)g_cpucount;
      uVar9 = 0;
      do {
        if (uVar9 < 0x400) {
          p_Var1 = g_cpu_affinity_mask_all.cpu_set.__bits + (uVar9 >> 6);
          *p_Var1 = *p_Var1 | 1L << ((byte)uVar9 & 0x3f);
        }
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
    }
    std::vector<int,_std::allocator<int>_>::vector
              (&local_450,(long)iVar12,(allocator_type *)&local_438);
    if (0 < g_cpucount) {
      uVar9 = 0;
      iVar12 = 0;
      iVar4 = 0x7fffffff;
      do {
        local_454 = iVar4;
        local_458 = iVar12;
        sprintf((char *)&local_438,"/sys/devices/system/cpu/cpufreq/stats/cpu%d/time_in_state",
                uVar9 & 0xffffffff);
        pFVar6 = fopen((char *)&local_438,"rb");
        if (pFVar6 == (FILE *)0x0) {
          sprintf((char *)&local_438,"/sys/devices/system/cpu/cpu%d/cpufreq/stats/time_in_state",
                  uVar9 & 0xffffffff);
          pFVar6 = fopen((char *)&local_438,"rb");
          if (pFVar6 != (FILE *)0x0) {
            iVar4 = 0;
            do {
              iVar15 = iVar4;
              iVar4 = feof(pFVar6);
              if (iVar4 != 0) break;
              local_45c = 0;
              iVar12 = __isoc99_fscanf(pFVar6,"%d %*d",&local_45c);
              iVar4 = local_45c;
              if (local_45c <= iVar15) {
                iVar4 = iVar15;
              }
            } while (iVar12 == 1);
            fclose(pFVar6);
            if (iVar15 != 0) goto LAB_005a0217;
          }
          sprintf((char *)&local_438,"/sys/devices/system/cpu/cpu%d/cpufreq/cpuinfo_max_freq",
                  uVar9 & 0xffffffff);
          pFVar6 = fopen((char *)&local_438,"rb");
          if (pFVar6 == (FILE *)0x0) {
            iVar15 = -1;
          }
          else {
            local_45c = -1;
            iVar4 = __isoc99_fscanf(pFVar6,"%d",&local_45c);
            if (iVar4 != 1) {
              try_initialize_global_cpu_info();
            }
            fclose(pFVar6);
            iVar15 = local_45c;
          }
        }
        else {
          iVar4 = 0;
          do {
            iVar15 = iVar4;
            iVar4 = feof(pFVar6);
            if (iVar4 != 0) break;
            local_45c = 0;
            iVar12 = __isoc99_fscanf(pFVar6,"%d %*d",&local_45c);
            iVar4 = local_45c;
            if (local_45c <= iVar15) {
              iVar4 = iVar15;
            }
          } while (iVar12 == 1);
          fclose(pFVar6);
        }
LAB_005a0217:
        iVar12 = local_458;
        if (local_458 < iVar15) {
          iVar12 = iVar15;
        }
        iVar4 = local_454;
        if (iVar15 < local_454) {
          iVar4 = iVar15;
        }
        *(int *)(CONCAT44(local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          (int)local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) + uVar9 * 4) = iVar15;
        uVar9 = uVar9 + 1;
      } while ((long)uVar9 < (long)g_cpucount);
      iVar4 = (iVar4 + iVar12) / 2;
      if (iVar4 == iVar12) {
        g_cpu_affinity_mask_little.cpu_set.__bits[0xe] = 0;
        g_cpu_affinity_mask_little.cpu_set.__bits[0xf] = 0;
        g_cpu_affinity_mask_little.cpu_set.__bits[0xc] = 0;
        g_cpu_affinity_mask_little.cpu_set.__bits[0xd] = 0;
        g_cpu_affinity_mask_little.cpu_set.__bits[10] = 0;
        g_cpu_affinity_mask_little.cpu_set.__bits[0xb] = 0;
        g_cpu_affinity_mask_little.cpu_set.__bits[8] = 0;
        g_cpu_affinity_mask_little.cpu_set.__bits[9] = 0;
        g_cpu_affinity_mask_little.cpu_set.__bits[6] = 0;
        g_cpu_affinity_mask_little.cpu_set.__bits[7] = 0;
        g_cpu_affinity_mask_little.cpu_set.__bits[4] = 0;
        g_cpu_affinity_mask_little.cpu_set.__bits[5] = 0;
        g_cpu_affinity_mask_little.cpu_set.__bits[2] = 0;
        g_cpu_affinity_mask_little.cpu_set.__bits[3] = 0;
        g_cpu_affinity_mask_little.cpu_set.__bits[0] = 0;
        g_cpu_affinity_mask_little.cpu_set.__bits[1] = 0;
        pCVar8 = &g_cpu_affinity_mask_all;
        pCVar14 = &g_cpu_affinity_mask_big;
        for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pCVar14->cpu_set).__bits[0] = (pCVar8->cpu_set).__bits[0];
          pCVar8 = (CpuSet *)((long)pCVar8 + ((ulong)bVar17 * -2 + 1) * 8);
          pCVar14 = (CpuSet *)((long)pCVar14 + ((ulong)bVar17 * -2 + 1) * 8);
        }
      }
      else if (0 < g_cpucount) {
        uVar9 = 0;
        do {
          sprintf((char *)&local_438,"/sys/devices/system/cpu/cpu%d/topology/core_cpus_list",
                  uVar9 & 0xffffffff);
          pFVar6 = fopen((char *)&local_438,"rb");
          if (pFVar6 == (FILE *)0x0) {
            sprintf((char *)&local_438,"/sys/devices/system/cpu/cpu%d/topology/thread_siblings_list"
                    ,uVar9 & 0xffffffff);
            pFVar6 = fopen((char *)&local_438,"rb");
            if (pFVar6 != (FILE *)0x0) goto LAB_005a0418;
LAB_005a0454:
            pCVar8 = &g_cpu_affinity_mask_big;
            if (*(int *)(CONCAT44(local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  (int)local_450.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start) + uVar9 * 4) <
                iVar4) {
              pCVar8 = &g_cpu_affinity_mask_little;
            }
          }
          else {
LAB_005a0418:
            do {
              iVar12 = feof(pFVar6);
              if (iVar12 != 0) {
                fclose(pFVar6);
                goto LAB_005a0454;
              }
              uVar5 = fgetc(pFVar6);
            } while ((uVar5 & 0xfe) != 0x2c);
            fclose(pFVar6);
            pCVar8 = &g_cpu_affinity_mask_big;
          }
          if (uVar9 < 0x400) {
            p_Var1 = (pCVar8->cpu_set).__bits + (uVar9 >> 6);
            *p_Var1 = *p_Var1 | 1L << ((byte)uVar9 & 0x3f);
          }
          uVar9 = uVar9 + 1;
        } while ((long)uVar9 < (long)g_cpucount);
      }
    }
    pvVar3 = (void *)CONCAT44(local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              (int)local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,(long)local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
    }
    get_elf_hwcap(0x10);
    get_elf_hwcap(0x1a);
    g_cpu_support_x86_fma = 0;
    puVar2 = (uint *)cpuid_basic_info(0);
    uVar5 = *puVar2;
    if ((int)uVar5 < 1) {
      g_cpu_support_x86_avx = 0;
      bVar16 = true;
    }
    else {
      lVar10 = cpuid_Version_info(1);
      if ((~*(uint *)(lVar10 + 0xc) & 0x1c000000) == 0) {
        g_cpu_support_x86_fma = 0;
        g_cpu_support_x86_avx = (int)((in_XCR0 & 6) == 6);
        bVar16 = true;
        if (6 < uVar5) {
          g_cpu_support_x86_fma = *(uint *)(lVar10 + 0xc) & 0x1000;
          bVar16 = false;
          if ((in_XCR0 & 6) != 6) {
            g_cpu_support_x86_fma = 0;
          }
        }
      }
      else {
        g_cpu_support_x86_avx = 0;
        bVar16 = uVar5 < 7;
        g_cpu_support_x86_fma = 0;
      }
    }
    puVar2 = (uint *)cpuid(0x80000000);
    g_cpu_support_x86_f16c = 0;
    g_cpu_support_x86_xop = 0;
    if (0x80000000 < *puVar2) {
      lVar10 = cpuid(0x80000001);
      g_cpu_support_x86_xop = *(uint *)(lVar10 + 0xc) & 0x800;
    }
    if (0 < (int)uVar5) {
      lVar10 = cpuid_Version_info(1);
      g_cpu_support_x86_f16c = *(uint *)(lVar10 + 0xc) & 0x20000000;
    }
    if ((bVar16) || (lVar10 = cpuid_Version_info(1), (~*(uint *)(lVar10 + 0xc) & 0x1c000000) != 0))
    {
      g_cpu_support_x86_avx512_fp16 = 0;
      g_cpu_support_x86_avx2 = 0;
      g_cpu_support_x86_avx_vnni = 0;
      g_cpu_support_x86_avx_vnni_int8 = 0;
      g_cpu_support_x86_avx_vnni_int16 = 0;
      g_cpu_support_x86_avx_ne_convert = 0;
      g_cpu_support_x86_avx512 = 0;
      g_cpu_support_x86_avx512_vnni = 0;
      g_cpu_support_x86_avx512_bf16 = 0;
    }
    else {
      g_cpu_support_x86_avx512 = 0;
      g_cpu_support_x86_avx2 = 0;
      g_cpu_support_x86_avx_vnni = 0;
      g_cpu_support_x86_avx_vnni_int8 = 0;
      g_cpu_support_x86_avx_vnni_int16 = 0;
      g_cpu_support_x86_avx_ne_convert = 0;
      if ((in_XCR0 & 6) == 6) {
        lVar10 = cpuid_Extended_Feature_Enumeration_info(7);
        g_cpu_support_x86_avx2 = *(uint *)(lVar10 + 4) & 0x20;
        puVar2 = (uint *)cpuid_Extended_Feature_Enumeration_info(7);
        uVar5 = puVar2[2];
        g_cpu_support_x86_avx_vnni = *puVar2 & 0x10;
        g_cpu_support_x86_avx_vnni_int8 = uVar5 & 0x10;
        g_cpu_support_x86_avx_vnni_int16 = uVar5 & 0x400;
        g_cpu_support_x86_avx_ne_convert = uVar5 & 0x20;
      }
      g_cpu_support_x86_avx512_vnni = 0;
      if ((in_XCR0 & 0xe6) == 0xe6) {
        lVar10 = cpuid_Extended_Feature_Enumeration_info(7);
        g_cpu_support_x86_avx512 = *(uint *)(lVar10 + 4) >> 0x1f;
        if ((~*(uint *)(lVar10 + 4) & 0x50030000) != 0) {
          g_cpu_support_x86_avx512 = 0;
        }
        g_cpu_support_x86_avx512_vnni = *(uint *)(lVar10 + 0xc) & 0x800;
      }
      g_cpu_support_x86_avx512_fp16 = 0;
      g_cpu_support_x86_avx512_bf16 = 0;
      if ((in_XCR0 & 6) == 6) {
        puVar2 = (uint *)cpuid_Extended_Feature_Enumeration_info(7);
        g_cpu_support_x86_avx512_bf16 = *puVar2 & 0x20;
      }
      if ((in_XCR0 & 0xe6) == 0xe6) {
        lVar10 = cpuid_Extended_Feature_Enumeration_info(7);
        g_cpu_support_x86_avx512_fp16 = *(uint *)(lVar10 + 8) & 0x800000;
      }
    }
    iVar4 = get_big_cpu_data_cache_size(2);
    if (iVar4 < 1) {
      lVar10 = sysconf(0xbf);
      iVar4 = (int)lVar10;
      if ((int)lVar10 < 1) {
        iVar12 = 0x40000;
        if (g_cpu_support_x86_avx2 == 0) {
          iVar12 = (uint)(g_cpu_support_x86_avx != 0) * 0x10000 + 0x10000;
        }
        iVar4 = 0x100000;
        if (g_cpu_support_x86_avx512 == 0) {
          iVar4 = iVar12;
        }
      }
    }
    g_cpu_level2_cachesize = iVar4;
    iVar4 = get_big_cpu_data_cache_size(3);
    if (iVar4 < 1) {
      lVar10 = sysconf(0xc2);
      iVar4 = (int)lVar10;
    }
    g_cpu_info_initialized = '\x01';
    g_cpu_level3_cachesize = iVar4;
  }
  return;
}

Assistant:

static inline void try_initialize_global_cpu_info()
{
    if (!g_cpu_info_initialized)
    {
        initialize_global_cpu_info();
        g_cpu_info_initialized = 1;
    }
}